

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

id gpt_sample_top_k_top_p
             (gpt_vocab *vocab,float *logits,int top_k,double top_p,double temp,mt19937 *rng)

{
  undefined8 uVar1;
  int iVar2;
  id iVar3;
  double *pdVar4;
  result_type_conflict rVar5;
  uint uVar6;
  pointer ppVar7;
  pair<double,_int> *kv_1;
  long lVar8;
  pointer ppVar9;
  __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
  __i;
  pair<double,_int> *ppVar10;
  ulong uVar11;
  long lVar12;
  size_type sVar13;
  bool bVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> logits_id;
  vector<double,_std::allocator<double>_> probs;
  discrete_distribution<int> dist;
  double local_c0;
  vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> local_b8;
  vector<double,_std::allocator<double>_> local_98;
  uint local_7c;
  param_type local_78;
  mt19937 *local_48;
  double local_40;
  double local_38;
  
  local_b8.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pair<double,_int> *)0x0;
  local_b8.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pair<double,_int> *)0x0;
  local_b8.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pair<double,_int> *)0x0;
  uVar6 = (uint)(vocab->id_to_token)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_48 = rng;
  local_40 = top_p;
  std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::reserve
            (&local_b8,(long)(int)uVar6);
  if (0 < (int)uVar6) {
    uVar11 = 0;
    do {
      local_78._M_prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)((double)logits[uVar11] * (1.0 / temp));
      local_78._M_prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = (undefined4)uVar11;
      if (local_b8.
          super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          local_b8.
          super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>::
        _M_realloc_insert<std::pair<double,int>>
                  ((vector<std::pair<double,int>,std::allocator<std::pair<double,int>>> *)&local_b8,
                   (iterator)
                   local_b8.
                   super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(pair<double,_int> *)&local_78);
      }
      else {
        (local_b8.
         super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
         _M_impl.super__Vector_impl_data._M_finish)->first =
             (double)local_78._M_prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
        *(ulong *)&(local_b8.
                    super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish)->second =
             CONCAT44(local_78._M_prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish._4_4_,
                      local_78._M_prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish._0_4_);
        local_b8.
        super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl
        .super__Vector_impl_data._M_finish =
             local_b8.
             super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
      }
      uVar11 = uVar11 + 1;
    } while ((uVar6 & 0x7fffffff) != uVar11);
  }
  ppVar9 = local_b8.
           super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  ppVar7 = local_b8.
           super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  sVar13 = (size_type)top_k;
  lVar12 = sVar13 * 0x10;
  ppVar10 = local_b8.
            super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_start + sVar13;
  local_7c = top_k;
  if (1 < top_k) {
    lVar8 = (long)((sVar13 - ((long)(sVar13 - 2) >> 0x3f)) + -2) >> 1;
    do {
      std::
      __adjust_heap<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,long,std::pair<double,int>,__gnu_cxx::__ops::_Iter_comp_iter<gpt_sample_top_k_top_p(gpt_vocab_const&,float_const*,int,double,double,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&)::__0>>
                (SUB84(ppVar7[lVar8].first,0),ppVar7,lVar8,sVar13,ppVar7[lVar8].second);
      bVar14 = lVar8 != 0;
      lVar8 = lVar8 + -1;
    } while (bVar14);
  }
  for (; uVar6 = local_7c, ppVar10 < ppVar9; ppVar10 = ppVar10 + 1) {
    if (ppVar7->first < ppVar10->first) {
      iVar2 = ppVar10->second;
      ppVar10->first = ppVar7->first;
      ppVar10->second = ppVar7->second;
      std::
      __adjust_heap<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,long,std::pair<double,int>,__gnu_cxx::__ops::_Iter_comp_iter<gpt_sample_top_k_top_p(gpt_vocab_const&,float_const*,int,double,double,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&)::__0>>
                (ppVar7,0,sVar13,iVar2);
    }
  }
  if (1 < (int)local_7c) {
    do {
      lVar8 = lVar12 + -0x10;
      uVar1 = *(undefined8 *)((long)&ppVar7[-1].first + lVar12);
      uVar15 = *(undefined4 *)((long)&ppVar7[-1].second + lVar12);
      *(double *)((long)&ppVar7[-1].first + lVar12) = ppVar7->first;
      *(int *)((long)&ppVar7[-1].second + lVar12) = ppVar7->second;
      std::
      __adjust_heap<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,long,std::pair<double,int>,__gnu_cxx::__ops::_Iter_comp_iter<gpt_sample_top_k_top_p(gpt_vocab_const&,float_const*,int,double,double,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&)::__0>>
                ((int)uVar1,ppVar7,0,lVar8 >> 4,uVar15);
      lVar12 = lVar8;
    } while (0x10 < lVar8);
  }
  std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::resize
            (&local_b8,sVar13);
  if (local_b8.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      local_b8.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_38 = -INFINITY;
  }
  else {
    uVar15 = 0;
    uVar16 = 0xfff00000;
    ppVar7 = local_b8.
             super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      local_38 = ppVar7->first;
      if (local_38 <= (double)CONCAT44(uVar16,uVar15)) {
        local_38 = (double)CONCAT44(uVar16,uVar15);
      }
      ppVar7 = ppVar7 + 1;
      uVar15 = SUB84(local_38,0);
      uVar16 = (undefined4)((ulong)local_38 >> 0x20);
    } while (ppVar7 != local_b8.
                       super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (double *)0x0;
  local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  std::vector<double,_std::allocator<double>_>::reserve
            (&local_98,
             (long)local_b8.
                   super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_b8.
                   super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4);
  ppVar7 = local_b8.
           super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (local_b8.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      local_b8.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_c0 = 0.0;
    pdVar4 = local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  else {
    local_c0 = 0.0;
    ppVar9 = local_b8.
             super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      local_78._M_prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)exp(ppVar9->first - local_38);
      if (local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&local_98,
                   (iterator)
                   local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,(double *)&local_78);
      }
      else {
        *local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish =
             (double)local_78._M_prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
        local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
      }
      local_c0 = local_c0 +
                 (double)local_78._M_prob.super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start;
      ppVar9 = ppVar9 + 1;
      pdVar4 = local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (ppVar9 != ppVar7);
  }
  for (; pdVar4 != local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish; pdVar4 = pdVar4 + 1) {
    *pdVar4 = *pdVar4 / local_c0;
  }
  if (local_40 < 1.0) {
    if ((int)uVar6 < 1) {
      local_c0 = 0.0;
    }
    else {
      local_c0 = 0.0;
      sVar13 = 1;
      do {
        local_c0 = local_c0 +
                   local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[sVar13 - 1];
        if (local_40 <= local_c0) {
          std::vector<double,_std::allocator<double>_>::resize(&local_98,sVar13);
          std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::resize
                    (&local_b8,sVar13);
          break;
        }
        bVar14 = sVar13 != uVar6;
        sVar13 = sVar13 + 1;
      } while (bVar14);
    }
    uVar6 = (uint)((ulong)((long)local_98.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start) >> 3);
    if (0 < (int)uVar6) {
      uVar11 = 0;
      do {
        local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[uVar11] =
             local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar11] * (1.0 / local_c0);
        uVar11 = uVar11 + 1;
      } while ((uVar6 & 0x7fffffff) != uVar11);
    }
  }
  std::discrete_distribution<int>::param_type::
  param_type<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            (&local_78,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish);
  rVar5 = std::discrete_distribution<int>::operator()
                    ((discrete_distribution<int> *)&local_78,local_48,&local_78);
  iVar3 = local_b8.
          super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_start[rVar5].second;
  if (local_78._M_cp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78._M_cp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78._M_cp.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_78._M_cp.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  if (local_78._M_prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78._M_prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78._M_prob.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78._M_prob.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_b8.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pair<double,_int> *)0x0) {
    operator_delete(local_b8.
                    super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b8.
                          super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.
                          super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return iVar3;
}

Assistant:

gpt_vocab::id gpt_sample_top_k_top_p(
        const gpt_vocab & vocab,
        const float * logits,
        int    top_k,
        double top_p,
        double temp,
        std::mt19937 & rng) {
    int n_logits = vocab.id_to_token.size();

    std::vector<std::pair<double, gpt_vocab::id>> logits_id;
    logits_id.reserve(n_logits);

    {
        const double scale = 1.0/temp;
        for (int i = 0; i < n_logits; ++i) {
            logits_id.push_back(std::make_pair(logits[i]*scale, i));
        }
    }

    // find the top K tokens
    std::partial_sort(
            logits_id.begin(),
            logits_id.begin() + top_k, logits_id.end(),
            [](const std::pair<double, gpt_vocab::id> & a, const std::pair<double, gpt_vocab::id> & b) {
        return a.first > b.first;
    });

    logits_id.resize(top_k);

    double maxl = -INFINITY;
    for (const auto & kv : logits_id) {
        maxl = std::max(maxl, kv.first);
    }

    // compute probs for the top K tokens
    std::vector<double> probs;
    probs.reserve(logits_id.size());

    double sum = 0.0;
    for (const auto & kv : logits_id) {
        double p = exp(kv.first - maxl);
        probs.push_back(p);
        sum += p;
    }

    // normalize the probs
    for (auto & p : probs) {
        p /= sum;
    }

    if (top_p < 1.0f) {
        double cumsum = 0.0f;
        for (int i = 0; i < top_k; i++) {
            cumsum += probs[i];
            if (cumsum >= top_p) {
                top_k = i + 1;
                probs.resize(top_k);
                logits_id.resize(top_k);
                break;
            }
        }

        cumsum = 1.0/cumsum;
        for (int i = 0; i < (int) probs.size(); i++) {
            probs[i] *= cumsum;
        }
    }

    //printf("\n");
    //for (int i = 0; i < (int) probs.size(); i++) {
    //    printf("%d: '%s' %f\n", i, vocab.id_to_token.at(logits_id[i].second).c_str(), probs[i]);
    //}
    //exit(0);

    std::discrete_distribution<> dist(probs.begin(), probs.end());
    int idx = dist(rng);

    return logits_id[idx].second;
}